

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# privsock.c
# Opt level: O1

void priv_sock_send_buf(int fd,char *buf,uint len)

{
  uint uVar1;
  int iVar2;
  in_addr_t iVar3;
  ssize_t sVar4;
  ssize_t sVar5;
  hostent *phVar6;
  uint extraout_EDX;
  char *buf_00;
  char *pcVar7;
  ulong uVar8;
  uint uVar9;
  char *pcVar10;
  msghdr *__message;
  sockaddr *__addr;
  char *__cp;
  undefined1 *puVar11;
  char *pcVar12;
  ulong uVar13;
  undefined4 uStack_1a4;
  sockaddr sStack_1a0;
  char acStack_190 [24];
  char *pcStack_178;
  char *pcStack_170;
  ulong uStack_168;
  code *pcStack_160;
  sockaddr sStack_158;
  undefined4 uStack_144;
  char *pcStack_140;
  char *pcStack_138;
  ulong uStack_130;
  code *pcStack_128;
  undefined1 uStack_119;
  iovec iStack_118;
  msghdr mStack_108;
  undefined1 auStack_d0 [16];
  code *pcStack_c0;
  undefined1 uStack_a9;
  iovec iStack_a8;
  undefined8 uStack_98;
  undefined8 uStack_90;
  undefined4 uStack_88;
  undefined1 auStack_78 [48];
  undefined8 uStack_48;
  ulong uStack_38;
  char *pcStack_30;
  
  pcVar7 = (char *)(ulong)(uint)fd;
  priv_sock_send_int(fd,len);
  buf_00 = buf;
  __cp = pcVar7;
  sVar4 = writen(fd,buf,(ulong)len);
  if ((uint)sVar4 == len) {
    return;
  }
  priv_sock_send_buf_cold_1();
  iVar2 = (int)__cp;
  pcVar12 = (char *)((ulong)__cp & 0xffffffff);
  uStack_48._0_4_ = 0x106478;
  uStack_48._4_4_ = 0;
  pcVar10 = buf_00;
  uStack_38 = (ulong)len;
  pcStack_30 = buf;
  uVar1 = priv_sock_get_int(iVar2);
  uStack_88 = SUB84(pcVar10,0);
  if (extraout_EDX < uVar1) {
    uStack_48._0_4_ = 0x1064a0;
    uStack_48._4_4_ = 0;
    priv_sock_recv_buf_cold_2();
  }
  else {
    pcVar7 = (char *)(ulong)uVar1;
    uStack_48._0_4_ = 0x10648c;
    uStack_48._4_4_ = 0;
    pcVar10 = buf_00;
    __cp = pcVar12;
    sVar4 = readn(iVar2,buf_00,(ulong)uVar1);
    uStack_88 = SUB84(pcVar10,0);
    if (uVar1 == (uint)sVar4) {
      return;
    }
  }
  uStack_48 = priv_sock_send_fd;
  priv_sock_recv_buf_cold_1();
  iStack_a8.iov_base = &uStack_a9;
  uStack_a9 = 0;
  auStack_78._32_8_ = &uStack_98;
  auStack_78._40_8_ = 0x18;
  uStack_90 = 0x100000001;
  uStack_98 = 0x14;
  auStack_78._0_8_ = (void *)0x0;
  auStack_78._8_4_ = 0;
  auStack_78._16_8_ = &iStack_a8;
  auStack_78._24_8_ = 1;
  uStack_48 = (code *)((ulong)uStack_48 & 0xffffffff00000000);
  iStack_a8.iov_len = 1;
  pcStack_c0 = (code *)0x106dbd;
  sVar5 = sendmsg((int)__cp,(msghdr *)auStack_78,0);
  if ((int)sVar5 == 1) {
    return;
  }
  pcStack_c0 = recv_fd;
  send_fd_cold_1();
  iStack_118.iov_base = &uStack_119;
  mStack_108.msg_iov = &iStack_118;
  iStack_118.iov_len = 1;
  __message = &mStack_108;
  mStack_108.msg_name = (void *)0x0;
  mStack_108.msg_namelen = 0;
  mStack_108.msg_iovlen = 1;
  mStack_108.msg_control = auStack_d0;
  mStack_108.msg_controllen = 0x18;
  mStack_108.msg_flags = 0;
  pcStack_c0 = (code *)CONCAT44(pcStack_c0._4_4_,0xffffffff);
  pcStack_128 = (code *)0x106e21;
  sVar5 = recvmsg((int)__cp,__message,0);
  if ((int)sVar5 == 1) {
    if ((mStack_108.msg_controllen < 0x10) ||
       ((undefined1 *)mStack_108.msg_control == (undefined1 *)0x0)) goto LAB_00106e4a;
    if (*(int *)((long)mStack_108.msg_control + 0x10) != -1) {
      return;
    }
  }
  else {
    pcStack_128 = (code *)0x106e4a;
    recv_fd_cold_1();
LAB_00106e4a:
    pcStack_128 = (code *)0x106e4f;
    recv_fd_cold_3();
  }
  pcStack_128 = tcp_server;
  recv_fd_cold_2();
  uVar8 = (ulong)__message & 0xffffffff;
  uVar13 = 0;
  pcStack_160 = (code *)0x106e77;
  pcStack_140 = buf_00;
  pcStack_138 = pcVar12;
  uStack_130 = (ulong)extraout_EDX;
  pcStack_128 = (code *)pcVar7;
  uVar1 = socket(2,1,0);
  if ((int)uVar1 < 0) {
    pcStack_160 = (code *)0x106f22;
    tcp_server_cold_3();
LAB_00106f22:
    iVar2 = (int)buf_00;
    pcStack_160 = (code *)0x106f29;
    tcp_server_cold_2();
  }
  else {
    buf_00 = (char *)(ulong)uVar1;
    sStack_158.sa_data[6] = '\0';
    sStack_158.sa_data[7] = '\0';
    sStack_158.sa_data[8] = '\0';
    sStack_158.sa_data[9] = '\0';
    sStack_158.sa_data[10] = '\0';
    sStack_158.sa_data[0xb] = '\0';
    sStack_158.sa_data[0xc] = '\0';
    sStack_158.sa_data[0xd] = '\0';
    sStack_158.sa_data._0_2_ = (ushort)uVar8 << 8 | (ushort)uVar8 >> 8;
    uVar8 = CONCAT62((int6)(uVar8 >> 0x10),sStack_158.sa_data._0_2_);
    sStack_158.sa_family = 2;
    sStack_158.sa_data._2_4_ = 0;
    if (__cp == (char *)0x0) {
LAB_00106ec9:
      sStack_158.sa_data._2_4_ = (int)uVar13;
LAB_00106ece:
      uStack_144 = 1;
      pcStack_160 = (code *)0x106ef0;
      setsockopt(uVar1,1,2,&uStack_144,4);
      pcStack_160 = (code *)0x106eff;
      iVar2 = bind(uVar1,&sStack_158,0x10);
      if (iVar2 != -1) {
        pcStack_160 = (code *)0x106f10;
        listen(uVar1,0x400);
        return;
      }
      goto LAB_00106f22;
    }
    pcStack_160 = (code *)0x106eae;
    iVar2 = inet_pton(2,__cp,sStack_158.sa_data + 2);
    if (iVar2 != 0) goto LAB_00106ece;
    pcStack_160 = (code *)0x106eba;
    pcVar7 = __cp;
    phVar6 = gethostbyname(__cp);
    iVar2 = (int)pcVar7;
    if (phVar6 != (hostent *)0x0) {
      uVar13 = (ulong)*(uint *)*phVar6->h_addr_list;
      goto LAB_00106ec9;
    }
  }
  pcStack_160 = tcp_client;
  tcp_server_cold_1();
  puVar11 = (undefined1 *)0x2;
  __addr = (sockaddr *)0x1;
  pcStack_178 = buf_00;
  pcStack_170 = __cp;
  uStack_168 = uVar13;
  pcStack_160 = (code *)uVar8;
  uVar1 = socket(2,1,0);
  if (-1 < (int)uVar1) {
    if (iVar2 != 0) {
      uStack_1a4 = 1;
      setsockopt(uVar1,1,2,&uStack_1a4,4);
      acStack_190[0] = '\0';
      acStack_190[1] = '\0';
      acStack_190[2] = '\0';
      acStack_190[3] = '\0';
      acStack_190[4] = '\0';
      acStack_190[5] = '\0';
      acStack_190[6] = '\0';
      acStack_190[7] = '\0';
      acStack_190[8] = '\0';
      acStack_190[9] = '\0';
      acStack_190[10] = '\0';
      acStack_190[0xb] = '\0';
      acStack_190[0xc] = '\0';
      acStack_190[0xd] = '\0';
      acStack_190[0xe] = '\0';
      acStack_190[0xf] = '\0';
      getlocalip(acStack_190);
      __addr = &sStack_1a0;
      sStack_1a0.sa_data[6] = '\0';
      sStack_1a0.sa_data[7] = '\0';
      sStack_1a0.sa_data[8] = '\0';
      sStack_1a0.sa_data[9] = '\0';
      sStack_1a0.sa_data[10] = '\0';
      sStack_1a0.sa_data[0xb] = '\0';
      sStack_1a0.sa_data[0xc] = '\0';
      sStack_1a0.sa_data[0xd] = '\0';
      sStack_1a0.sa_data._0_2_ = (short)iVar2;
      sStack_1a0.sa_family = 2;
      sStack_1a0.sa_data._2_4_ = 0;
      iVar3 = inet_addr(acStack_190);
      sStack_1a0.sa_data._2_4_ = iVar3;
      puVar11 = (undefined1 *)(ulong)uVar1;
      iVar2 = bind(uVar1,__addr,0x10);
      if (iVar2 < 0) goto LAB_00106fd3;
    }
    return;
  }
  tcp_client_cold_2();
LAB_00106fd3:
  tcp_client_cold_1();
  *puVar11 = 0x3f;
  uVar9 = (uint)__addr;
  uVar1 = (uVar9 & 0xf000) - 0x1000;
  if ((uVar1 < 0xc000) && (uVar1 = uVar1 >> 0xc, (0xaabU >> (uVar1 & 0x1f) & 1) != 0)) {
    *puVar11 = (&DAT_00108f14)[uVar1];
  }
  if ((uVar9 >> 8 & 1) != 0) {
    puVar11[1] = 0x72;
  }
  if ((char)__addr < '\0') {
    puVar11[2] = 0x77;
  }
  if (((ulong)__addr & 0x40) != 0) {
    puVar11[3] = 0x78;
  }
  if (((ulong)__addr & 0x20) != 0) {
    puVar11[4] = 0x72;
  }
  if (((ulong)__addr & 0x10) != 0) {
    puVar11[5] = 0x77;
  }
  if (((ulong)__addr & 8) != 0) {
    puVar11[6] = 0x78;
  }
  if (((ulong)__addr & 4) != 0) {
    puVar11[7] = 0x72;
  }
  if (((ulong)__addr & 2) != 0) {
    puVar11[8] = 0x77;
  }
  if (((ulong)__addr & 1) != 0) {
    puVar11[9] = 0x78;
  }
  if ((uVar9 >> 0xb & 1) != 0) {
    puVar11[3] = (puVar11[3] == 'x') << 5 | 0x53;
  }
  if ((uVar9 >> 10 & 1) != 0) {
    puVar11[6] = (puVar11[6] == 'x') << 5 | 0x53;
  }
  if ((uVar9 >> 9 & 1) != 0) {
    puVar11[9] = (puVar11[9] == 'x') << 5 | 0x53;
  }
  return;
}

Assistant:

void priv_sock_send_buf(int fd, const char *buf, unsigned int len) {
  // send the str len
  priv_sock_send_int(fd, len);
  // send the str
  int ret = writen(fd, buf, len);
  if (ret != (int) len) {
    fprintf(stderr, "priv_sock_send_buf error\n");
    exit(EXIT_FAILURE);
  }
}